

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extension_set.h
# Opt level: O2

void __thiscall
google::protobuf::internal::RepeatedPrimitiveDefaults::~RepeatedPrimitiveDefaults
          (RepeatedPrimitiveDefaults *this)

{
  RepeatedField<bool>::~RepeatedField(&this->default_repeated_field_bool_);
  RepeatedField<float>::~RepeatedField(&this->default_repeated_field_float_);
  RepeatedField<double>::~RepeatedField(&this->default_repeated_field_double_);
  RepeatedField<unsigned_long>::~RepeatedField(&this->default_repeated_field_uint64_t_);
  RepeatedField<unsigned_int>::~RepeatedField(&this->default_repeated_field_uint32_t_);
  RepeatedField<long>::~RepeatedField(&this->default_repeated_field_int64_t_);
  RepeatedField<int>::~RepeatedField(&this->default_repeated_field_int32_t_);
  return;
}

Assistant:

class PROTOBUF_EXPORT RepeatedPrimitiveDefaults {
 private:
  template <typename Type>
  friend class RepeatedPrimitiveTypeTraits;
  static const RepeatedPrimitiveDefaults* default_instance();
  RepeatedField<int32_t> default_repeated_field_int32_t_;
  RepeatedField<int64_t> default_repeated_field_int64_t_;
  RepeatedField<uint32_t> default_repeated_field_uint32_t_;
  RepeatedField<uint64_t> default_repeated_field_uint64_t_;
  RepeatedField<double> default_repeated_field_double_;
  RepeatedField<float> default_repeated_field_float_;
  RepeatedField<bool> default_repeated_field_bool_;
}